

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomLayerParams::CustomLayerParams
          (CustomLayerParams *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CustomLayerParams_00489c38;
  (this->weights_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->weights_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weights_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->parameters_).map_.elements_.num_elements_ = 0;
  (this->parameters_).map_.elements_.num_buckets_ = 1;
  (this->parameters_).map_.elements_.seed_ = 0;
  (this->parameters_).map_.elements_.index_of_first_non_null_ = 1;
  (this->parameters_).map_.elements_.table_ =
       (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->parameters_).map_.elements_.alloc_.arena_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  (this->classname_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->description_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  return;
}

Assistant:

CustomLayerParams::CustomLayerParams(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  weights_(arena),
  parameters_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.CustomLayerParams)
}